

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

double fmt::v5::internal::round(double __x)

{
  type tVar1;
  int iVar2;
  int in_ECX;
  int *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  double extraout_XMM0_Qa;
  int digit;
  int digits_to_remove_local;
  int *exp_local;
  size_t *size_local;
  char *buffer_local;
  
  tVar1 = to_unsigned<int>(in_ECX);
  *in_RSI = *in_RSI - (ulong)tVar1;
  *in_RDX = in_ECX + *in_RDX;
  iVar2 = *(char *)(in_RDI + *in_RSI) + -0x30;
  if (iVar2 < 6) {
    if (iVar2 != 5) {
      return extraout_XMM0_Qa;
    }
    bVar3 = true;
    if (in_ECX < 2) {
      bVar3 = (*(char *)(in_RDI + *in_RSI + -1) + -0x30) % 2 != 0;
    }
    if (!bVar3) {
      return extraout_XMM0_Qa;
    }
  }
  *(char *)(in_RDI + *in_RSI + -1) = *(char *)(in_RDI + *in_RSI + -1) + '\x01';
  return extraout_XMM0_Qa;
}

Assistant:

FMT_FUNC void round(char *buffer, size_t &size, int &exp,
                    int digits_to_remove) {
  size -= to_unsigned(digits_to_remove);
  exp += digits_to_remove;
  int digit = buffer[size] - '0';
  // TODO: proper rounding and carry
  if (digit > 5 || (digit == 5 && (digits_to_remove > 1 ||
                                   (buffer[size - 1] - '0') % 2) != 0)) {
    ++buffer[size - 1];
  }
}